

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O0

void sha256_Final(SHA256_CTX *context,sha2_byte *digest)

{
  uint uVar1;
  int local_30;
  uint32_t tmp_2;
  int j_2;
  uint32_t tmp_1;
  int j_1;
  uint32_t tmp;
  int j;
  uint usedspace;
  sha2_byte *digest_local;
  SHA256_CTX *context_local;
  
  if (digest != (sha2_byte *)0x0) {
    uVar1 = (uint)(context->bitcount >> 3) & 0x3f;
    tmp = uVar1 + 1;
    *(undefined1 *)((long)context->buffer + (ulong)uVar1) = 0x80;
    if (0x38 < tmp) {
      memzero((void *)((long)context->buffer + (ulong)tmp),(ulong)(0x40 - tmp));
      for (j_1 = 0; j_1 < 0x10; j_1 = j_1 + 1) {
        uVar1 = context->buffer[j_1] >> 0x10 | context->buffer[j_1] << 0x10;
        context->buffer[j_1] = uVar1 >> 8 & 0xff00ff | (uVar1 & 0xff00ff) << 8;
      }
      sha256_Transform(context->state,context->buffer,context->state);
      tmp = 0;
    }
    memzero((void *)((long)context->buffer + (ulong)tmp),(ulong)(0x38 - tmp));
    for (j_2 = 0; j_2 < 0xe; j_2 = j_2 + 1) {
      uVar1 = context->buffer[j_2] >> 0x10 | context->buffer[j_2] << 0x10;
      context->buffer[j_2] = uVar1 >> 8 & 0xff00ff | (uVar1 & 0xff00ff) << 8;
    }
    context->buffer[0xe] = (uint32_t)(context->bitcount >> 0x20);
    context->buffer[0xf] = (uint32_t)context->bitcount;
    sha256_Transform(context->state,context->buffer,context->state);
    for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
      uVar1 = context->state[local_30] >> 0x10 | context->state[local_30] << 0x10;
      context->state[local_30] = uVar1 >> 8 & 0xff00ff | (uVar1 & 0xff00ff) << 8;
    }
    *(undefined8 *)digest = *(undefined8 *)context->state;
    *(undefined8 *)(digest + 8) = *(undefined8 *)(context->state + 2);
    *(undefined8 *)(digest + 0x10) = *(undefined8 *)(context->state + 4);
    *(undefined8 *)(digest + 0x18) = *(undefined8 *)(context->state + 6);
  }
  memzero(context,0x68);
  return;
}

Assistant:

void sha256_Final(trezor::SHA256_CTX* context, sha2_byte digest[]) {
	unsigned int	usedspace;

	/* If no digest buffer is passed, we don't bother doing this: */
	if (digest != (sha2_byte*)0) {
		usedspace = (context->bitcount >> 3) % SHA256_BLOCK_LENGTH;
		/* Begin padding with a 1 bit: */
		((uint8_t*)context->buffer)[usedspace++] = 0x80;
		
		if (usedspace > SHA256_SHORT_BLOCK_LENGTH) {
			memzero(((uint8_t*)context->buffer) + usedspace, SHA256_BLOCK_LENGTH - usedspace);

#if BYTE_ORDER == LITTLE_ENDIAN
			/* Convert TO host byte order */
			for (int j = 0; j < 16; j++) {
				REVERSE32(context->buffer[j],context->buffer[j]);
			}
#endif
			/* Do second-to-last transform: */
			sha256_Transform(context->state, context->buffer, context->state);
			
			/* And prepare the last transform: */
			usedspace = 0;
		}
		/* Set-up for the last transform: */
		memzero(((uint8_t*)context->buffer) + usedspace, SHA256_SHORT_BLOCK_LENGTH - usedspace);

#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert TO host byte order */
		for (int j = 0; j < 14; j++) {
			REVERSE32(context->buffer[j],context->buffer[j]);
		}
#endif
		/* Set the bit count: */
		context->buffer[14] = context->bitcount >> 32;
		context->buffer[15] = context->bitcount & 0xffffffff;

		/* Final transform: */
		sha256_Transform(context->state, context->buffer, context->state);

#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert FROM host byte order */
		for (int j = 0; j < 8; j++) {
			REVERSE32(context->state[j],context->state[j]);
		}
#endif
		MEMCPY_BCOPY(digest, context->state, SHA256_DIGEST_LENGTH);
	}

	/* Clean up state data: */
	memzero(context, sizeof(trezor::SHA256_CTX));
}